

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaFree(xmlSchemaPtr schema)

{
  long *plVar1;
  xmlSchemaAnnotPtr pxVar2;
  _xmlSchemaAnnot *p_Var3;
  _xmlSchemaAnnot *p_Var4;
  long lVar5;
  
  if (schema == (xmlSchemaPtr)0x0) {
    return;
  }
  if (schema->notaDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->notaDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->attrDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->attrDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->attrgrpDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->attrgrpDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->elemDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->elemDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->typeDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->typeDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->groupDecl != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->groupDecl,(xmlHashDeallocator)0x0);
  }
  if (schema->idcDef != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->idcDef,(xmlHashDeallocator)0x0);
  }
  if (schema->schemasImports != (xmlHashTablePtr)0x0) {
    xmlHashFree(schema->schemasImports,xmlSchemaBucketFreeEntry);
  }
  plVar1 = (long *)schema->includes;
  if (plVar1 != (long *)0x0) {
    if (0 < (int)plVar1[1]) {
      lVar5 = 0;
      do {
        xmlSchemaBucketFree(*(xmlSchemaBucketPtr_conflict *)(*plVar1 + lVar5 * 8));
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)plVar1[1]);
    }
    if ((void *)*plVar1 != (void *)0x0) {
      (*xmlFree)((void *)*plVar1);
    }
    (*xmlFree)(plVar1);
  }
  pxVar2 = schema->annot;
  if (pxVar2 != (xmlSchemaAnnotPtr)0x0) {
    p_Var3 = pxVar2->next;
    (*xmlFree)(pxVar2);
    while (p_Var3 != (_xmlSchemaAnnot *)0x0) {
      p_Var4 = p_Var3->next;
      (*xmlFree)(p_Var3);
      p_Var3 = p_Var4;
    }
  }
  xmlDictFree(schema->dict);
  (*xmlFree)(schema);
  return;
}

Assistant:

void
xmlSchemaFree(xmlSchemaPtr schema)
{
    if (schema == NULL)
        return;
    /*
    * Note that those slots are not responsible for freeing
    * schema components anymore; this will now be done by
    * the schema buckets.
    */
    if (schema->notaDecl != NULL)
        xmlHashFree(schema->notaDecl, NULL);
    if (schema->attrDecl != NULL)
        xmlHashFree(schema->attrDecl, NULL);
    if (schema->attrgrpDecl != NULL)
        xmlHashFree(schema->attrgrpDecl, NULL);
    if (schema->elemDecl != NULL)
        xmlHashFree(schema->elemDecl, NULL);
    if (schema->typeDecl != NULL)
        xmlHashFree(schema->typeDecl, NULL);
    if (schema->groupDecl != NULL)
        xmlHashFree(schema->groupDecl, NULL);
    if (schema->idcDef != NULL)
        xmlHashFree(schema->idcDef, NULL);

    if (schema->schemasImports != NULL)
	xmlHashFree(schema->schemasImports, xmlSchemaBucketFreeEntry);
    if (schema->includes != NULL) {
	xmlSchemaItemListPtr list = (xmlSchemaItemListPtr) schema->includes;
	int i;
	for (i = 0; i < list->nbItems; i++) {
	    xmlSchemaBucketFree((xmlSchemaBucketPtr) list->items[i]);
	}
	xmlSchemaItemListFree(list);
    }
    if (schema->annot != NULL)
        xmlSchemaFreeAnnot(schema->annot);
    /* Never free the doc here, since this will be done by the buckets. */

    xmlDictFree(schema->dict);
    xmlFree(schema);
}